

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O2

token __thiscall
wigwag::token::
create<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,std::__cxx11::string>>,wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>::handler_node,wigwag::detail::intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,std::__cxx11::string>>,wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>>&,std::shared_ptr<IObservableDictionaryListener<int,std::__cxx11::string>>>
          (token *this,
          intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
          *args,shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args_1)

{
  handler_node *this_00;
  intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  local_40;
  handler_type local_38;
  
  this_00 = (handler_node *)operator_new(0x40);
  local_40 = (intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
              )args->_raw;
  if (local_40._raw !=
      (listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
       *)0x0) {
    LOCK();
    ((local_40._raw)->
    super_intrusive_ref_counter<wigwag::ref_counter::atomic,_wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
    ).super_atomic._counter.super___atomic_base<int>._M_i =
         ((local_40._raw)->
         super_intrusive_ref_counter<wigwag::ref_counter::atomic,_wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
         ).super_atomic._counter.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38.
  super___shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (args_1->
            super___shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  local_38.
  super___shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (args_1->
       super___shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
       )._M_refcount._M_pi;
  (args_1->
  super___shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (args_1->
  super___shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = (element_type *)0x0;
  detail::
  listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  ::handler_node::handler_node(this_00,&local_40,&local_38);
  this->_impl = (implementation *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.
              super___shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  detail::
  intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  ::~intrusive_ptr(&local_40);
  return (token)(implementation *)this;
}

Assistant:

static token create(Args_&&... args)
        { return token(new Implementation_(std::forward<Args_>(args)...)); }